

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> __thiscall
Parser::parseBlockStmt(Parser *this)

{
  Parser *in_RSI;
  undefined1 local_50 [8];
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  statements;
  
  eatToken(in_RSI,LeftBrace);
  statements.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statements.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statements.
  super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while ((in_RSI->m_currToken).type != RightBrace) {
    parseStmt((Parser *)local_50);
    std::
    vector<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>,std::allocator<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>>
    ::emplace_back<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>
              ((vector<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>,std::allocator<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>>
                *)&statements,(unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)local_50);
    if (local_50 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
    eatToken(in_RSI,EOL);
  }
  eatToken(in_RSI,RightBrace);
  std::
  make_unique<AST::BlockStmt,std::vector<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>,std::allocator<std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>>>
            ((vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
              *)this);
  std::
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  ::~vector(&statements);
  return (__uniq_ptr_data<AST::BlockStmt,_std::default_delete<AST::BlockStmt>,_true,_true>)
         (__uniq_ptr_data<AST::BlockStmt,_std::default_delete<AST::BlockStmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::BlockStmt> Parser::parseBlockStmt() {
    eatToken(TokenType::LeftBrace);
    std::vector<std::unique_ptr<AST::Stmt>> statements;
    while (m_currToken.type != TokenType::RightBrace) {
        statements.push_back(parseStmt());
        eatToken(TokenType::EOL);
    }
    eatToken(TokenType::RightBrace);
    return std::make_unique<AST::BlockStmt>(std::move(statements));
}